

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O2

float calculateEuclideanDistance(FeatureVec *a,FeatureVec *b)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pfVar1 = (a->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(a->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  pfVar2 = (b->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar3 == (long)(b->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar2) {
    auVar6 = ZEXT816(0) << 0x40;
    for (lVar4 = 0; lVar3 >> 2 != lVar4; lVar4 = lVar4 + 1) {
      auVar7._0_8_ = (double)(pfVar1[lVar4] - pfVar2[lVar4]);
      auVar7._8_8_ = 0;
      auVar5._0_8_ = (double)auVar6._0_4_;
      auVar5._8_8_ = auVar6._8_8_;
      auVar5 = vfmadd231sd_fma(auVar5,auVar7,auVar7);
      auVar6._0_4_ = (float)auVar5._0_8_;
      auVar6._4_12_ = auVar5._4_12_;
    }
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    return auVar6._0_4_;
  }
  __assert_fail("a.size() == b.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-km/src/utils/FeatureVec.cpp"
                ,0x2b,"float calculateEuclideanDistance(FeatureVec, FeatureVec)");
}

Assistant:

float calculateEuclideanDistance(FeatureVec a, FeatureVec b) {
  assert(a.size() == b.size());
  float dist = 0.0f;
  // Loop over all features
  for (size_t f = 0; f < a.size(); f++) {
    // Accumulate the squared difference
    dist += std::pow(a[f] - b[f], 2);
  }
  // Return the square root
  return std::sqrt(dist);
}